

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

void __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_3U>::overlap_iterator::unionWith
          (overlap_iterator *this,monostate *value,allocator_type *alloc)

{
  Path *other;
  interval<unsigned_long> *key;
  Path *this_00;
  uint32_t *puVar1;
  uint32_t uVar2;
  IntervalMap<unsigned_long,_std::monostate,_3U> *pIVar3;
  pointer pEVar4;
  size_type sVar5;
  void *pvVar6;
  IntervalMap<unsigned_long,_std::monostate,_3U> *pIVar7;
  overlap_iterator *poVar8;
  ulong uVar9;
  uint uVar10;
  unsigned_long *puVar11;
  long lVar12;
  overlap_iterator *poVar13;
  unsigned_long uVar14;
  BranchNode<unsigned_long,_2U,_true> *self;
  overlap_iterator *poVar15;
  ulong uVar16;
  ulong uVar17;
  LeafNode<unsigned_long,_std::monostate,_3U,_true> *self_2;
  ulong *puVar18;
  ulong uVar19;
  bool bVar20;
  iterator nextIt;
  iterator local_70;
  
  pIVar3 = (this->super_iterator).super_const_iterator.map;
  uVar10 = pIVar3->rootSize;
  if (pIVar3->height == 0) {
    if (uVar10 != 0) {
      uVar9 = (this->searchKey).left;
      puVar11 = &(pIVar3->field_0).rootLeaf.
                 super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                 .first[0].right;
      poVar13 = (overlap_iterator *)0x0;
      poVar15 = this;
      do {
        if (((interval<unsigned_long> *)(puVar11 + -1))->left < uVar9) {
          bVar20 = *puVar11 + 1 < uVar9;
          poVar8 = poVar15;
          if (!bVar20) {
            poVar8 = poVar13;
          }
        }
        else {
          bVar20 = false;
          poVar8 = poVar13;
        }
        poVar15 = (overlap_iterator *)((ulong)poVar8 & 0xffffffff);
        if (!bVar20) {
          uVar10 = (uint)poVar8;
          break;
        }
        poVar13 = (overlap_iterator *)
                  ((long)&(poVar13->super_iterator).super_const_iterator.map + 1);
        puVar11 = puVar11 + 2;
      } while ((overlap_iterator *)(ulong)uVar10 != poVar13);
    }
    const_iterator::setRoot((const_iterator *)this,uVar10);
  }
  else {
    if (uVar10 != 0) {
      uVar9 = (this->searchKey).left;
      puVar11 = (unsigned_long *)
                ((long)((pIVar3->field_0).rootLeaf.
                        super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                        .first + 1) + 8);
      poVar13 = (overlap_iterator *)0x0;
      poVar15 = this;
      do {
        if (((interval<unsigned_long> *)(puVar11 + -1))->left < uVar9) {
          bVar20 = *puVar11 + 1 < uVar9;
          poVar8 = poVar15;
          if (!bVar20) {
            poVar8 = poVar13;
          }
        }
        else {
          bVar20 = false;
          poVar8 = poVar13;
        }
        poVar15 = (overlap_iterator *)((ulong)poVar8 & 0xffffffff);
        if (!bVar20) {
          uVar10 = (uint)poVar8;
          break;
        }
        poVar13 = (overlap_iterator *)
                  ((long)&(poVar13->super_iterator).super_const_iterator.map + 1);
        puVar11 = puVar11 + 2;
      } while ((overlap_iterator *)(ulong)uVar10 != poVar13);
    }
    const_iterator::setRoot((const_iterator *)this,uVar10);
    treeFindUnion(this);
  }
  if (((this->super_iterator).super_const_iterator.path.path.
       super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len == 0) ||
     (other = &(this->super_iterator).super_const_iterator.path,
     pEVar4 = (other->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_,
     pEVar4->size <= pEVar4->offset)) {
    iterator::insert(&this->super_iterator,(this->searchKey).left,(this->searchKey).right,value,
                     alloc);
    return;
  }
  pEVar4 = (this->super_iterator).super_const_iterator.path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  sVar5 = (this->super_iterator).super_const_iterator.path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  lVar12 = (ulong)pEVar4[sVar5 - 1].offset * 0x10;
  key = &this->searchKey;
  uVar9 = (this->searchKey).left;
  uVar14 = (this->searchKey).right;
  if ((*(long *)((long)pEVar4[sVar5 - 1].node + lVar12 + 8) + 1U < uVar9) ||
     (uVar14 + 1 < *(ulong *)((long)pEVar4[sVar5 - 1].node + lVar12))) {
    iterator::insert(&this->super_iterator,uVar9,uVar14,value,alloc);
  }
  else {
    pvVar6 = pEVar4[sVar5 - 1].node;
    uVar16 = *(ulong *)((long)pvVar6 + lVar12 + 8);
    uVar17 = *(ulong *)((long)pvVar6 + lVar12);
    if (uVar9 < *(ulong *)((long)pvVar6 + lVar12)) {
      uVar17 = uVar9;
    }
    *(ulong *)((long)pvVar6 + lVar12) = uVar17;
    if (uVar14 < uVar16) {
      uVar14 = uVar16;
    }
    *(unsigned_long *)((long)pvVar6 + lVar12 + 8) = uVar14;
    uVar14 = ((unsigned_long *)((long)pvVar6 + lVar12))[1];
    key->left = *(unsigned_long *)((long)pvVar6 + lVar12);
    (this->searchKey).right = uVar14;
    iterator::updateParentBounds(&this->super_iterator,(int)sVar5 - 1,key);
  }
  this_00 = &local_70.super_const_iterator.path;
  while( true ) {
    while( true ) {
      pIVar7 = (this->super_iterator).super_const_iterator.map;
      pEVar4 = (this->super_iterator).super_const_iterator.path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
      sVar5 = (this->super_iterator).super_const_iterator.path.path.
              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
      uVar10 = pEVar4[sVar5 - 1].offset + 1;
      uVar2 = pIVar7->height;
      pvVar6 = pEVar4[sVar5 - 1].node;
      if (uVar2 == 0) {
        if (uVar10 < pEVar4[sVar5 - 1].size) {
          bVar20 = *(ulong *)((long)pvVar6 + (ulong)uVar10 * 0x10) <= (this->searchKey).right + 1;
        }
        else {
          bVar20 = false;
        }
      }
      else if (uVar10 < pEVar4[sVar5 - 1].size) {
        bVar20 = *(ulong *)((long)pvVar6 + (ulong)uVar10 * 0x10) <= (this->searchKey).right + 1;
      }
      else {
        bVar20 = false;
      }
      puVar18 = (ulong *)((long)pvVar6 + (ulong)uVar10 * 0x10);
      if (!bVar20) break;
      uVar9 = *puVar18;
      uVar16 = puVar18[1];
      pvVar6 = pEVar4[sVar5 - 1].node;
      lVar12 = (ulong)pEVar4[sVar5 - 1].offset * 0x10;
      uVar17 = *(ulong *)((long)pvVar6 + lVar12 + 8);
      uVar19 = *(ulong *)((long)pvVar6 + lVar12);
      if (uVar9 < *(ulong *)((long)pvVar6 + lVar12)) {
        uVar19 = uVar9;
      }
      *(ulong *)((long)pvVar6 + lVar12) = uVar19;
      if (uVar16 < uVar17) {
        uVar16 = uVar17;
      }
      *(ulong *)((long)pvVar6 + lVar12 + 8) = uVar16;
      uVar14 = ((unsigned_long *)((long)pvVar6 + lVar12))[1];
      key->left = *(unsigned_long *)((long)pvVar6 + lVar12);
      (this->searchKey).right = uVar14;
      pEVar4[sVar5 - 1].offset = uVar10;
      iterator::erase(&this->super_iterator,alloc,false);
      puVar1 = &(this->super_iterator).super_const_iterator.path.path.
                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                [(this->super_iterator).super_const_iterator.path.path.
                 super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].offset;
      *puVar1 = *puVar1 - 1;
    }
    if (uVar2 == 0) {
      return;
    }
    if (uVar10 != pEVar4[sVar5 - 1].size) {
      return;
    }
    local_70.super_const_iterator.map = pIVar7;
    SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL>::SmallVector
              (&this_00->path,(Base *)other);
    IntervalMapDetails::Path::moveRight(this_00,pIVar3->height);
    if ((((local_70.super_const_iterator.path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len == 0) ||
         ((local_70.super_const_iterator.path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->size <=
          (local_70.super_const_iterator.path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->offset)) ||
        (local_70.super_const_iterator.path.path.
         super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
         [local_70.super_const_iterator.path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].size == 0)) ||
       (puVar18 = (ulong *)local_70.super_const_iterator.path.path.
                           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                           [local_70.super_const_iterator.path.path.
                            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                           node, (this->searchKey).right + 1 < *puVar18)) break;
    uVar9 = puVar18[1];
    pEVar4 = (this->super_iterator).super_const_iterator.path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    sVar5 = (this->super_iterator).super_const_iterator.path.path.
            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
    pvVar6 = pEVar4[sVar5 - 1].node;
    lVar12 = (ulong)pEVar4[sVar5 - 1].offset * 0x10;
    uVar16 = *(ulong *)((long)pvVar6 + lVar12 + 8);
    uVar17 = *(ulong *)((long)pvVar6 + lVar12);
    if (*puVar18 < *(ulong *)((long)pvVar6 + lVar12)) {
      uVar17 = *puVar18;
    }
    *(ulong *)((long)pvVar6 + lVar12) = uVar17;
    if (uVar9 < uVar16) {
      uVar9 = uVar16;
    }
    *(ulong *)((long)pvVar6 + lVar12 + 8) = uVar9;
    uVar14 = ((unsigned_long *)((long)pvVar6 + lVar12))[1];
    key->left = *(unsigned_long *)((long)pvVar6 + lVar12);
    (this->searchKey).right = uVar14;
    iterator::updateParentBounds(&this->super_iterator,(int)sVar5 - 1,key);
    bVar20 = iterator::erase(&local_70,alloc,true);
    if (bVar20) {
      SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator=
                ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)other,
                 (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)this_00);
      IntervalMapDetails::Path::moveLeft(other,pIVar3->height);
    }
    if (local_70.super_const_iterator.path.path.
        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
        (pointer)local_70.super_const_iterator.path.path.
                 super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.firstElement) {
      operator_delete(local_70.super_const_iterator.path.path.
                      super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
    }
  }
  if (local_70.super_const_iterator.path.path.
      super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
      (pointer)local_70.super_const_iterator.path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.firstElement) {
    operator_delete(local_70.super_const_iterator.path.path.
                    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::overlap_iterator::unionWith(const TValue& value,
                                                               allocator_type& alloc) {
    using namespace IntervalMapDetails;

    auto& map = *this->map;
    auto& path = this->path;
    if (this->isFlat()) {
        this->setRoot(map.rootLeaf.findUnionLeft(0, map.rootSize, searchKey));
    }
    else {
        this->setRoot(map.rootBranch.findUnionLeft(0, map.rootSize, searchKey));
        treeFindUnion();
    }

    // The iterator now points to one of the following:
    // - The first existing interval that overlaps (or is adjacent to) the search key
    // - The correct place to insert the search key as a new interval
    // - The end of the map (also the correct place to insert)
    if (!valid()) {
        // We're at the end of the map so just insert and we're done.
        this->insert(searchKey.left, searchKey.right, value, alloc);
        return;
    }

    auto getCurrKey = [&]() -> interval<TKey>& {
        auto offset = path.leafOffset();
        return this->isFlat() ? path.template leaf<RootLeaf>().keyAt(offset)
                              : path.template leaf<Leaf>().keyAt(offset);
    };

    auto updateCurrKey = [&](interval<TKey> newKey) {
        // Expand the current entry to match our new item.
        auto& currKey = getCurrKey();
        currKey.unionWith(newKey);
        searchKey = currKey;
    };

    if (!getCurrKey().overlapsOrAdjacent(searchKey)) {
        this->insert(searchKey.left, searchKey.right, value, alloc);
    }
    else {
        // Otherwise expand the current entry to match our new item.
        updateCurrKey(searchKey);
        this->updateParentBounds(path.height(), searchKey);
    }

    // Our new interval is inserted or updated. Continue forward and
    // merge all later intervals that overlap with this one.
    while (true) {
        uint32_t offset = path.leafOffset() + 1;
        bool canUnionRight;
        interval<TKey> currKey;
        if (this->isFlat()) {
            auto& leaf = path.template leaf<RootLeaf>();
            canUnionRight = leaf.canUnionRight(offset, path.leafSize(), searchKey);
            currKey = leaf.keyAt(offset);
        }
        else {
            auto& leaf = path.template leaf<Leaf>();
            canUnionRight = leaf.canUnionRight(offset, path.leafSize(), searchKey);
            currKey = leaf.keyAt(offset);
        }

        if (canUnionRight) {
            // This does not change our parent bounds so no need to update.
            updateCurrKey(currKey);

            path.leafOffset() = offset;
            bool modifiedPath = this->erase(alloc, false);
            SLANG_ASSERT(!modifiedPath);

            path.leafOffset()--;
        }
        else if (offset == path.leafSize() && !this->isFlat()) {
            // Copy our iterator and advance to the next node to see if we can merge
            // with it. This intentionally slices the object since we don't need the
            // wider overlapped_iterator here.
            iterator nextIt = *this;
            nextIt.path.moveRight(map.height);
            if (!nextIt.valid() || !nextIt.path.template leaf<Leaf>().canUnionRight(
                                       0, nextIt.path.leafSize(), searchKey)) {
                // Nope, we're done.
                return;
            }

            // Merge and erase the next elem.
            updateCurrKey(nextIt.path.template leaf<Leaf>().keyAt(0));
            this->updateParentBounds(path.height(), searchKey);

            if (nextIt.erase(alloc, true)) {
                // The erase operation deleted nodes so our path is invalid.
                // Get back to a good state by copying from the nextIt's path
                // and then moving back left.
                path = nextIt.path;
                path.moveLeft(map.height);
            }
        }
        else {
            return;
        }
    }
}